

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O0

string * libtorrent::convert_to_native(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  wchar_t *pwVar2;
  type_conflict2 *ptVar3;
  size_t sVar4;
  char *extraout_RDX;
  string_view str;
  undefined1 auVar5 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  ulong local_b0;
  size_t i;
  size_t size;
  char out [10];
  type_conflict2 *len;
  type_conflict2 *codepoint;
  pair<int,_int> local_40;
  undefined1 auStack_38 [8];
  string_view ptr;
  mbstate_t local_20;
  mbstate_t state;
  string *s_local;
  string *ret;
  
  state = (mbstate_t)s;
  bVar1 = anon_unknown_5::need_conversion();
  if (bVar1) {
    memset(&local_20,0,8);
    ptr._M_str._7_1_ = 0;
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    auVar5 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)state);
    while( true ) {
      ptr._M_len = auVar5._8_8_;
      auStack_38 = auVar5._0_8_;
      bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_38);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      str._M_str = extraout_RDX;
      str._M_len = ptr._M_len;
      local_40 = aux::parse_utf8_codepoint((aux *)auStack_38,str);
      pwVar2 = ::std::get<0ul,int,int>(&local_40);
      ptVar3 = ::std::get<1ul,int,int>(&local_40);
      if (*pwVar2 == L'\xffffffff') {
        *pwVar2 = L'.';
      }
      bVar6 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_38,
                         (long)*ptVar3,0xffffffffffffffff);
      ptr._M_len = (size_t)bVar6._M_str;
      out._2_8_ = bVar6._M_len;
      auStack_38 = (undefined1  [8])out._2_8_;
      sVar4 = wcrtomb((char *)((long)&size + 6),*pwVar2,&local_20);
      if (sVar4 == 0xffffffffffffffff) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
        auVar5._8_8_ = ptr._M_len;
        auVar5._0_8_ = auStack_38;
        local_20.__count = 0;
        local_20.__value = (_union_27)0x0;
      }
      else {
        for (local_b0 = 0; auVar5._8_8_ = ptr._M_len, auVar5._0_8_ = auStack_38, local_b0 < sVar4;
            local_b0 = local_b0 + 1) {
          ::std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,*(char *)((long)&size + local_b0 + 6));
        }
      }
    }
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)state);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convert_to_native(std::string const& s)
	{
		if (!need_conversion()) return s;

		std::mbstate_t state{};
		std::string ret;
		string_view ptr = s;
		while (!ptr.empty())
		{
			// decode a single utf-8 character
			auto [codepoint, len] = aux::parse_utf8_codepoint(ptr);

			if (codepoint == -1)
				codepoint = '.';

			ptr = ptr.substr(std::size_t(len));

			char out[10];
			std::size_t const size = std::wcrtomb(out, static_cast<wchar_t>(codepoint), &state);
			if (size == static_cast<std::size_t>(-1))
			{
				ret += '.';
				state = std::mbstate_t{};
			}
			else
				for (std::size_t i = 0; i < size; ++i)
					ret += out[i];
		}
		return ret;
	}